

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acbp_v1.cpp
# Opt level: O3

void __thiscall intel_acbp_v1_t::pmsg_body_t::~pmsg_body_t(pmsg_body_t *this)

{
  signature_t *psVar1;
  public_key_t *ppVar2;
  
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__pmsg_body_t_00185300;
  psVar1 = (this->m_signature)._M_t.
           super___uniq_ptr_impl<intel_acbp_v1_t::signature_t,_std::default_delete<intel_acbp_v1_t::signature_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_intel_acbp_v1_t::signature_t_*,_std::default_delete<intel_acbp_v1_t::signature_t>_>
           .super__Head_base<0UL,_intel_acbp_v1_t::signature_t_*,_false>._M_head_impl;
  if (psVar1 != (signature_t *)0x0) {
    (**(code **)((long)(psVar1->super_kstruct)._vptr_kstruct + 8))();
  }
  (this->m_signature)._M_t.
  super___uniq_ptr_impl<intel_acbp_v1_t::signature_t,_std::default_delete<intel_acbp_v1_t::signature_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_intel_acbp_v1_t::signature_t_*,_std::default_delete<intel_acbp_v1_t::signature_t>_>
  .super__Head_base<0UL,_intel_acbp_v1_t::signature_t_*,_false>._M_head_impl = (signature_t *)0x0;
  ppVar2 = (this->m_public_key)._M_t.
           super___uniq_ptr_impl<intel_acbp_v1_t::public_key_t,_std::default_delete<intel_acbp_v1_t::public_key_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_intel_acbp_v1_t::public_key_t_*,_std::default_delete<intel_acbp_v1_t::public_key_t>_>
           .super__Head_base<0UL,_intel_acbp_v1_t::public_key_t_*,_false>._M_head_impl;
  if (ppVar2 != (public_key_t *)0x0) {
    (**(code **)((long)(ppVar2->super_kstruct)._vptr_kstruct + 8))();
  }
  (this->m_public_key)._M_t.
  super___uniq_ptr_impl<intel_acbp_v1_t::public_key_t,_std::default_delete<intel_acbp_v1_t::public_key_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_intel_acbp_v1_t::public_key_t_*,_std::default_delete<intel_acbp_v1_t::public_key_t>_>
  .super__Head_base<0UL,_intel_acbp_v1_t::public_key_t_*,_false>._M_head_impl = (public_key_t *)0x0;
  return;
}

Assistant:

intel_acbp_v1_t::pmsg_body_t::~pmsg_body_t() {
    _clean_up();
}